

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O1

void __thiscall Assimp::ColladaParser::ReadDataArray(ColladaParser *this)

{
  pointer *ppfVar1;
  iterator __position;
  int iVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Assimp *this_00;
  mapped_type *pmVar5;
  undefined8 uVar6;
  uint uVar7;
  bool bVar8;
  string s;
  string id;
  string elmName;
  value_type local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  key_type local_98;
  long *local_78 [2];
  long local_68 [2];
  string local_58;
  
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,(char *)CONCAT44(extraout_var,iVar2),(allocator<char> *)&local_d8);
  iVar2 = std::__cxx11::string::compare((char *)local_78);
  if (iVar2 == 0) {
    bVar8 = true;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)local_78);
    bVar8 = iVar2 == 0;
  }
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  uVar3 = GetAttribute(this,"id");
  iVar4 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,(char *)CONCAT44(extraout_var_00,iVar4),
             (allocator<char> *)&local_d8);
  uVar3 = GetAttribute(this,"count");
  uVar3 = (*this->mReader->_vptr_IIrrXMLReader[10])(this->mReader,(ulong)uVar3);
  this_00 = (Assimp *)TestTextContent(this);
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.field_2._M_allocated_capacity = 0;
  local_d8.field_2._8_8_ = 0;
  local_d8._M_dataplus._M_p = (pointer)0x0;
  local_d8._M_string_length = 0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Data>_>_>
           ::operator[](&this->mDataLibrary,&local_98);
  pmVar5->mIsStringArray = local_d8._M_dataplus._M_p._0_1_;
  std::vector<float,_std::allocator<float>_>::_M_move_assign(&pmVar5->mValues);
  local_58._M_dataplus._M_p =
       (pointer)(pmVar5->mStrings).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_58._M_string_length =
       (size_type)
       (pmVar5->mStrings).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_58.field_2._M_allocated_capacity =
       (size_type)
       (pmVar5->mStrings).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pmVar5->mStrings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_b8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (pmVar5->mStrings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_b8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (pmVar5->mStrings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_b8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  uVar6 = 0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  if ((void *)local_d8._M_string_length != (void *)0x0) {
    operator_delete((void *)local_d8._M_string_length,
                    local_d8.field_2._8_8_ - local_d8._M_string_length);
  }
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Data>_>_>
           ::operator[](&this->mDataLibrary,&local_98);
  pmVar5->mIsStringArray = bVar8;
  if (this_00 != (Assimp *)0x0) {
    if (bVar8 == false) {
      std::vector<float,_std::allocator<float>_>::reserve(&pmVar5->mValues,(ulong)uVar3);
      if (uVar3 != 0) {
        uVar7 = 0;
        do {
          if (*this_00 == (Assimp)0x0) {
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_d8,
                       "Expected more values while reading float_array contents.","");
            ThrowException(this,&local_d8);
          }
          this_00 = (Assimp *)
                    fast_atoreal_move<float>(this_00,(char *)&local_d8,(float *)0x1,SUB81(uVar6,0));
          __position._M_current =
               (pmVar5->mValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (pmVar5->mValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                      ((vector<float,std::allocator<float>> *)&pmVar5->mValues,__position,
                       (float *)&local_d8);
          }
          else {
            *__position._M_current = local_d8._M_dataplus._M_p._0_4_;
            ppfVar1 = &(pmVar5->mValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppfVar1 = *ppfVar1 + 1;
          }
          while (((ulong)(byte)*this_00 < 0x21 &&
                 ((0x100002600U >> ((ulong)(byte)*this_00 & 0x3f) & 1) != 0))) {
            this_00 = this_00 + 1;
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar3);
      }
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve(&pmVar5->mStrings,(ulong)uVar3);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      local_d8._M_string_length = 0;
      local_d8.field_2._M_allocated_capacity =
           local_d8.field_2._M_allocated_capacity & 0xffffffffffffff00;
      if (uVar3 != 0) {
        uVar7 = 0;
        do {
          if (*this_00 == (Assimp)0x0) {
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_58,
                       "Expected more values while reading IDREF_array contents.","");
            ThrowException(this,&local_58);
          }
          local_d8._M_string_length = 0;
          *local_d8._M_dataplus._M_p = '\0';
          while ((0x20 < (ulong)(byte)*this_00 ||
                 ((0x100003601U >> ((ulong)(byte)*this_00 & 0x3f) & 1) == 0))) {
            this_00 = this_00 + 1;
            std::__cxx11::string::push_back((char)&local_d8);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&pmVar5->mStrings,&local_d8);
          while (((ulong)(byte)*this_00 < 0x21 &&
                 ((0x100002600U >> ((ulong)(byte)*this_00 & 0x3f) & 1) != 0))) {
            this_00 = this_00 + 1;
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if ((char)iVar2 == '\0') {
    TestClosing(this,(char *)local_78[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  return;
}

Assistant:

void ColladaParser::ReadDataArray()
{
    std::string elmName = mReader->getNodeName();
    bool isStringArray = (elmName == "IDREF_array" || elmName == "Name_array");
    bool isEmptyElement = mReader->isEmptyElement();

    // read attributes
    int indexID = GetAttribute("id");
    std::string id = mReader->getAttributeValue(indexID);
    int indexCount = GetAttribute("count");
    unsigned int count = (unsigned int)mReader->getAttributeValueAsInt(indexCount);
    const char* content = TestTextContent();

    // read values and store inside an array in the data library
    mDataLibrary[id] = Data();
    Data& data = mDataLibrary[id];
    data.mIsStringArray = isStringArray;

    // some exporters write empty data arrays, but we need to conserve them anyways because others might reference them
    if (content)
    {
        if (isStringArray)
        {
            data.mStrings.reserve(count);
            std::string s;

            for (unsigned int a = 0; a < count; a++)
            {
                if (*content == 0)
                    ThrowException("Expected more values while reading IDREF_array contents.");

                s.clear();
                while (!IsSpaceOrNewLine(*content))
                    s += *content++;
                data.mStrings.push_back(s);

                SkipSpacesAndLineEnd(&content);
            }
        }
        else
        {
            data.mValues.reserve(count);

            for (unsigned int a = 0; a < count; a++)
            {
                if (*content == 0)
                    ThrowException("Expected more values while reading float_array contents.");

                ai_real value;
                // read a number
                content = fast_atoreal_move<ai_real>(content, value);
                data.mValues.push_back(value);
                // skip whitespace after it
                SkipSpacesAndLineEnd(&content);
            }
        }
    }

    // test for closing tag
    if (!isEmptyElement)
        TestClosing(elmName.c_str());
}